

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_inst.c
# Opt level: O2

uint32 get_import_func_count(module *m)

{
  uint32 uVar1;
  long lVar2;
  
  uVar1 = 0;
  for (lVar2 = 0; (ulong)(m->import_sec).import_segment_count * 0x30 - lVar2 != 0;
      lVar2 = lVar2 + 0x30) {
    uVar1 = uVar1 + ((&(((m->import_sec).import_segment_addr)->im_desc).tag)[lVar2] == '\0');
  }
  return uVar1;
}

Assistant:

uint32 get_import_func_count(module *m) {
    uint32 count = 0;
    for (uint32 i = 0; i < m->import_sec.import_segment_count; i++) {
        if ((m->import_sec.import_segment_addr + i)->im_desc.tag == func_im_export_tag)
            count++;
    }
    return count;
}